

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_acs.cpp
# Opt level: O0

FArchive * operator<<(FArchive *arc,acsdefered_t **defertop)

{
  bool bVar1;
  acsdefered_t *paVar2;
  FArchive *pFVar3;
  acsdefered_t *local_38;
  acsdefered_t **defer_1;
  acsdefered_t *paStack_28;
  BYTE type;
  acsdefered_t *defer;
  acsdefered_t *paStack_18;
  BYTE more;
  acsdefered_t **defertop_local;
  FArchive *arc_local;
  
  paStack_18 = (acsdefered_t *)defertop;
  defertop_local = (acsdefered_t **)arc;
  bVar1 = FArchive::IsStoring(arc);
  if (bVar1) {
    paStack_28 = paStack_18->next;
    defer._7_1_ = 1;
    for (; paStack_28 != (acsdefered_t *)0x0; paStack_28 = paStack_28->next) {
      FArchive::operator<<((FArchive *)defertop_local,(BYTE *)((long)&defer + 7));
      defer_1._7_1_ = (undefined1)paStack_28->type;
      FArchive::operator<<((FArchive *)defertop_local,(BYTE *)((long)&defer_1 + 7));
      P_SerializeACSScriptNumber((FArchive *)defertop_local,&paStack_28->script,false);
      pFVar3 = FArchive::operator<<((FArchive *)defertop_local,&paStack_28->playernum);
      pFVar3 = FArchive::operator<<(pFVar3,paStack_28->args);
      pFVar3 = FArchive::operator<<(pFVar3,paStack_28->args + 1);
      FArchive::operator<<(pFVar3,paStack_28->args + 2);
    }
    defer._7_1_ = 0;
    FArchive::operator<<((FArchive *)defertop_local,(BYTE *)((long)&defer + 7));
  }
  else {
    local_38 = paStack_18;
    FArchive::operator<<((FArchive *)defertop_local,(BYTE *)((long)&defer + 7));
    while (defer._7_1_ != 0) {
      paVar2 = (acsdefered_t *)operator_new(0x20);
      local_38->next = paVar2;
      FArchive::operator<<((FArchive *)defertop_local,(BYTE *)((long)&defer + 7));
      local_38->next->type = (uint)defer._7_1_;
      P_SerializeACSScriptNumber((FArchive *)defertop_local,&local_38->next->script,false);
      pFVar3 = FArchive::operator<<((FArchive *)defertop_local,&local_38->next->playernum);
      pFVar3 = FArchive::operator<<(pFVar3,local_38->next->args);
      pFVar3 = FArchive::operator<<(pFVar3,local_38->next->args + 1);
      FArchive::operator<<(pFVar3,local_38->next->args + 2);
      local_38 = local_38->next;
      FArchive::operator<<((FArchive *)defertop_local,(BYTE *)((long)&defer + 7));
    }
    local_38->next = (acsdefered_t *)0x0;
  }
  return (FArchive *)defertop_local;
}

Assistant:

FArchive &operator<< (FArchive &arc, acsdefered_t *&defertop)
{
	BYTE more;

	if (arc.IsStoring ())
	{
		acsdefered_t *defer = defertop;
		more = 1;
		while (defer)
		{
			BYTE type;
			arc << more;
			type = (BYTE)defer->type;
			arc << type;
			P_SerializeACSScriptNumber(arc, defer->script, false);
			arc << defer->playernum << defer->args[0] << defer->args[1] << defer->args[2];
			defer = defer->next;
		}
		more = 0;
		arc << more;
	}
	else
	{
		acsdefered_t **defer = &defertop;

		arc << more;
		while (more)
		{
			*defer = new acsdefered_t;
			arc << more;
			(*defer)->type = (acsdefered_t::EType)more;
			P_SerializeACSScriptNumber(arc, (*defer)->script, false);
			arc << (*defer)->playernum << (*defer)->args[0] << (*defer)->args[1] << (*defer)->args[2];
			defer = &((*defer)->next);
			arc << more;
		}
		*defer = NULL;
	}
	return arc;
}